

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflateSync(z_streamp strm)

{
  undefined4 uVar1;
  internal_state *piVar2;
  ulong uVar3;
  uLong uVar4;
  ulg uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  inflate_state *state;
  uLong uStack_30;
  uchar buf [4];
  unsigned_long out;
  unsigned_long in;
  int flags;
  uint len;
  z_streamp strm_local;
  
  iVar6 = inflateStateCheck(strm);
  if (iVar6 == 0) {
    piVar2 = strm->state;
    if ((strm->avail_in == 0) && (piVar2->w_mask < 8)) {
      strm_local._4_4_ = -5;
    }
    else {
      if (piVar2->status != 0x3f53) {
        piVar2->status = 0x3f53;
        lVar8._0_4_ = piVar2->w_size;
        lVar8._4_4_ = piVar2->w_bits;
        lVar8 = lVar8 << ((byte)piVar2->w_mask & 7);
        piVar2->w_size = (int)lVar8;
        piVar2->w_bits = (int)((ulong)lVar8 >> 0x20);
        piVar2->w_mask = piVar2->w_mask - (piVar2->w_mask & 7);
        in._4_4_ = 0;
        while (7 < piVar2->w_mask) {
          uVar1 = piVar2->w_size;
          *(char *)((long)&state + (ulong)in._4_4_ + 4) = (char)uVar1;
          uVar3._0_4_ = piVar2->w_size;
          uVar3._4_4_ = piVar2->w_bits;
          piVar2->w_size = (int)(uVar3 >> 8);
          piVar2->w_bits = (int)((uVar3 >> 8) >> 0x20);
          piVar2->w_mask = piVar2->w_mask - 8;
          in._4_4_ = in._4_4_ + 1;
        }
        piVar2->hash_mask = 0;
        syncsearch(&piVar2->hash_mask,(uchar *)((long)&state + 4),in._4_4_);
      }
      uVar7 = syncsearch(&piVar2->hash_mask,strm->next_in,strm->avail_in);
      strm->avail_in = strm->avail_in - uVar7;
      strm->next_in = strm->next_in + uVar7;
      strm->total_in = (ulong)uVar7 + strm->total_in;
      if (piVar2->hash_mask == 4) {
        if ((int)piVar2->pending_buf_size == -1) {
          *(undefined4 *)&piVar2->pending_buf = 0;
        }
        else {
          *(uint *)&piVar2->pending_buf = *(uint *)&piVar2->pending_buf & 0xfffffffb;
        }
        uVar5 = piVar2->pending_buf_size;
        uVar4 = strm->total_in;
        uStack_30 = strm->total_out;
        cm_zlib_inflateReset(strm);
        strm->total_in = uVar4;
        strm->total_out = uStack_30;
        *(int *)&piVar2->pending_buf_size = (int)uVar5;
        piVar2->status = 0x3f3f;
        strm_local._4_4_ = 0;
      }
      else {
        strm_local._4_4_ = -3;
      }
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateSync(strm)
z_streamp strm;
{
    unsigned len;               /* number of bytes to look at or looked at */
    int flags;                  /* temporary to save header status */
    unsigned long in, out;      /* temporary to save total_in and total_out */
    unsigned char buf[4];       /* to restore bit buffer to byte string */
    struct inflate_state FAR *state;

    /* check parameters */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (strm->avail_in == 0 && state->bits < 8) return Z_BUF_ERROR;

    /* if first time, start search in bit buffer */
    if (state->mode != SYNC) {
        state->mode = SYNC;
        state->hold <<= state->bits & 7;
        state->bits -= state->bits & 7;
        len = 0;
        while (state->bits >= 8) {
            buf[len++] = (unsigned char)(state->hold);
            state->hold >>= 8;
            state->bits -= 8;
        }
        state->have = 0;
        syncsearch(&(state->have), buf, len);
    }

    /* search available input */
    len = syncsearch(&(state->have), strm->next_in, strm->avail_in);
    strm->avail_in -= len;
    strm->next_in += len;
    strm->total_in += len;

    /* return no joy or set up to restart inflate() on a new block */
    if (state->have != 4) return Z_DATA_ERROR;
    if (state->flags == -1)
        state->wrap = 0;    /* if no header yet, treat as raw */
    else
        state->wrap &= ~4;  /* no point in computing a check value now */
    flags = state->flags;
    in = strm->total_in;  out = strm->total_out;
    inflateReset(strm);
    strm->total_in = in;  strm->total_out = out;
    state->flags = flags;
    state->mode = TYPE;
    return Z_OK;
}